

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void __thiscall
xmrig::Workers<xmrig::CpuLaunchData>::tick(Workers<xmrig::CpuLaunchData> *this,uint64_t param_2)

{
  Thread<xmrig::CpuLaunchData> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference ppTVar4;
  IWorker *pIVar5;
  size_t threadId;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_RDI;
  Thread<xmrig::CpuLaunchData> *handle;
  iterator __end0;
  iterator __begin0;
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  *__range1;
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  *in_stack_ffffffffffffffa8;
  Hashrate *in_stack_ffffffffffffffb0;
  __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
  local_20 [4];
  
  if (**(long **)(in_RDI + 0x18) != 0) {
    local_20[0]._M_current =
         (Thread<xmrig::CpuLaunchData> **)
         std::
         vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
         ::begin(in_stack_ffffffffffffffa8);
    std::
    vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
    ::end(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      ppTVar4 = __gnu_cxx::
                __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
                ::operator*(local_20);
      this_00 = *ppTVar4;
      pIVar5 = Thread<xmrig::CpuLaunchData>::worker(this_00);
      if (pIVar5 != (IWorker *)0x0) {
        in_stack_ffffffffffffffb0 = (Hashrate *)**(undefined8 **)(in_RDI + 0x18);
        threadId = Thread<xmrig::CpuLaunchData>::id(this_00);
        pIVar5 = Thread<xmrig::CpuLaunchData>::worker(this_00);
        iVar2 = (*pIVar5->_vptr_IWorker[6])();
        pIVar5 = Thread<xmrig::CpuLaunchData>::worker(this_00);
        iVar3 = (*pIVar5->_vptr_IWorker[7])();
        Hashrate::add(in_stack_ffffffffffffffb0,threadId,CONCAT44(extraout_var,iVar2),
                      CONCAT44(extraout_var_00,iVar3));
      }
      __gnu_cxx::
      __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

void xmrig::Workers<T>::tick(uint64_t)
{
    if (!d_ptr->hashrate) {
        return;
    }

    for (Thread<T> *handle : m_workers) {
        if (!handle->worker()) {
            continue;
        }

        d_ptr->hashrate->add(handle->id(), handle->worker()->hashCount(), handle->worker()->timestamp());
    }
}